

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.h
# Opt level: O0

void __thiscall draco::Mesh::SetFace(Mesh *this,FaceIndex face_id,Face *face)

{
  bool bVar1;
  uint uVar2;
  size_t sVar3;
  IndexType<unsigned_int,_draco::FaceIndex_tag_type_> *in_RDX;
  array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL> *in_RDI;
  size_t in_stack_ffffffffffffffb8;
  IndexTypeVector<draco::IndexType<unsigned_int,_draco::FaceIndex_tag_type_>,_std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>
  *in_stack_ffffffffffffffc0;
  array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL> *in_stack_ffffffffffffffc8
  ;
  undefined1 local_28 [12];
  uint local_1c;
  IndexType<unsigned_int,_draco::FaceIndex_tag_type_> *local_18;
  IndexType<unsigned_int,_draco::FaceIndex_tag_type_> local_4;
  
  local_18 = in_RDX;
  sVar3 = IndexTypeVector<draco::IndexType<unsigned_int,_draco::FaceIndex_tag_type_>,_std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>
          ::size((IndexTypeVector<draco::IndexType<unsigned_int,_draco::FaceIndex_tag_type_>,_std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>
                  *)0x118b88);
  local_1c = (uint)sVar3;
  bVar1 = IndexType<unsigned_int,_draco::FaceIndex_tag_type_>::operator>=(&local_4,&local_1c);
  if (bVar1) {
    in_stack_ffffffffffffffc0 =
         (IndexTypeVector<draco::IndexType<unsigned_int,_draco::FaceIndex_tag_type_>,_std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>
          *)(in_RDI + 0x10);
    uVar2 = IndexType<unsigned_int,_draco::FaceIndex_tag_type_>::value(&local_4);
    in_stack_ffffffffffffffc8 =
         (array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL> *)
         (ulong)(uVar2 + 1);
    memset(local_28,0,0xc);
    std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>::array(in_RDI);
    IndexTypeVector<draco::IndexType<unsigned_int,_draco::FaceIndex_tag_type_>,_std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>
    ::resize(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
             (array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL> *)0x118bf4);
  }
  IndexTypeVector<draco::IndexType<unsigned_int,_draco::FaceIndex_tag_type_>,_std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>
  ::operator[](in_stack_ffffffffffffffc0,local_18);
  std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>::operator=
            (in_RDI,in_stack_ffffffffffffffc8);
  return;
}

Assistant:

void SetFace(FaceIndex face_id, const Face &face) {
    if (face_id >= static_cast<uint32_t>(faces_.size())) {
      faces_.resize(face_id.value() + 1, Face());
    }
    faces_[face_id] = face;
  }